

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int __thiscall google::protobuf::internal::SooRep::size(SooRep *this,bool is_soo)

{
  bool *v1;
  bool *v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  int local_5c;
  LogMessageFatal local_38 [22];
  Voidify local_22;
  bool local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  SooRep *pSStack_10;
  bool is_soo_local;
  SooRep *this_local;
  
  absl_log_internal_check_op_result._7_1_ = is_soo;
  pSStack_10 = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&absl_log_internal_check_op_result + 7));
  local_21 = SooRep::is_soo(this);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_21);
  local_20 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_soo == this->is_soo()");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0xc5,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_22,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    local_5c = (this->field_0).long_rep.size;
  }
  else {
    local_5c = ShortSooRep::size((ShortSooRep *)this);
  }
  return local_5c;
}

Assistant:

int size(bool is_soo) const {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#endif
    return is_soo ? short_rep.size() : long_rep.size;
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }